

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

void glfwGetMonitorWorkarea(GLFWmonitor *handle,int *xpos,int *ypos,int *width,int *height)

{
  _GLFWmonitor *monitor;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/src/monitor.c"
                  ,0x158,"void glfwGetMonitorWorkarea(GLFWmonitor *, int *, int *, int *, int *)");
  }
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (width != (int *)0x0) {
    *width = 0;
  }
  if (height != (int *)0x0) {
    *height = 0;
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformGetMonitorWorkarea((_GLFWmonitor *)handle,xpos,ypos,width,height);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorWorkarea(GLFWmonitor* handle,
                                    int* xpos, int* ypos,
                                    int* width, int* height)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;
    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorWorkarea(monitor, xpos, ypos, width, height);
}